

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O2

bool __thiscall
Assimp::FindDegeneratesProcess::ExecuteOnMesh(FindDegeneratesProcess *this,aiMesh *mesh)

{
  aiVector3D *paVar1;
  uint *puVar2;
  void *pvVar3;
  aiFace *paVar4;
  bool bVar5;
  ulong uVar6;
  Logger *pLVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint a;
  aiFace *paVar13;
  ulong uVar14;
  ulong uVar15;
  ai_real aVar16;
  ai_real aVar17;
  ai_real aVar18;
  double dVar19;
  float fVar20;
  reference rVar21;
  vector<bool,_std::allocator<bool>_> remove_me;
  aiVector3D vB;
  aiVector3D vA;
  byte local_225;
  int local_224;
  _Bvector_base<std::allocator<bool>_> local_200;
  aiVector3D local_1d8;
  aiVector3D local_1c8 [2];
  undefined1 local_1a8 [376];
  
  mesh->mPrimitiveTypes = 0;
  local_200._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_200._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_200._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_200._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_200._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  if (this->mConfigRemoveDegenerates == true) {
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)&local_200,(ulong)mesh->mNumFaces,false);
  }
  local_224 = 0;
  for (uVar14 = 0; uVar6 = (ulong)mesh->mNumFaces, uVar14 < uVar6; uVar14 = uVar14 + 1) {
    paVar13 = mesh->mFaces + uVar14;
    local_225 = 1;
    uVar6 = 0;
    do {
      do {
        uVar8 = paVar13->mNumIndices;
        uVar15 = (ulong)uVar8;
        if (uVar15 <= uVar6) {
          uVar12 = mesh->mPrimitiveTypes;
          if (uVar8 == 3) {
            mesh->mPrimitiveTypes = uVar12 | 4;
          }
          else {
            if (uVar8 == 2) {
              uVar12 = uVar12 | 2;
            }
            else if (uVar8 == 1) {
              uVar12 = uVar12 | 1;
            }
            else {
              uVar12 = uVar12 | 8;
            }
            mesh->mPrimitiveTypes = uVar12;
          }
          goto LAB_003b546f;
        }
        uVar12 = (int)uVar6 + 2;
        uVar10 = (ulong)uVar12;
        if (uVar8 <= uVar12) {
          uVar10 = uVar15;
        }
        if (uVar8 < 5) {
          uVar10 = uVar15;
        }
        uVar15 = uVar6 + 1;
        uVar11 = uVar15 & 0xffffffff;
        while( true ) {
          uVar8 = (uint)uVar11;
          if ((uint)uVar10 <= uVar8) break;
          bVar5 = aiVector3t<float>::operator==
                            (mesh->mVertices + paVar13->mIndices[uVar6],
                             mesh->mVertices + paVar13->mIndices[uVar11]);
          if (bVar5) {
            uVar12 = paVar13->mNumIndices - 1;
            paVar13->mNumIndices = uVar12;
            for (; uVar11 < uVar12; uVar11 = uVar11 + 1) {
              paVar13->mIndices[uVar11] = paVar13->mIndices[uVar11 + 1];
              uVar12 = paVar13->mNumIndices;
            }
            paVar13->mIndices[uVar12] = 0xdeadbeef;
            local_224 = local_224 + (uint)local_225;
            if (local_225 != 0) {
              local_225 = 0;
            }
            if (this->mConfigRemoveDegenerates != false) {
              rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)&local_200,uVar14);
              *rVar21._M_p = *rVar21._M_p | rVar21._M_mask;
              goto LAB_003b546f;
            }
            uVar10 = (ulong)((uint)uVar10 - 1);
            uVar8 = uVar8 - 1;
          }
          uVar11 = (ulong)(uVar8 + 1);
        }
        uVar6 = uVar15;
      } while ((this->mConfigCheckAreaOfTriangle != true) || (paVar13->mNumIndices != 3));
      paVar1 = mesh->mVertices;
      puVar2 = paVar13->mIndices;
      local_1a8._8_4_ = paVar1[*puVar2].z;
      local_1a8._0_8_ = *(undefined8 *)(paVar1 + *puVar2);
      local_1c8[0].z = paVar1[puVar2[1]].z;
      local_1c8[0]._0_8_ = *(undefined8 *)(paVar1 + puVar2[1]);
      local_1d8.z = paVar1[puVar2[2]].z;
      local_1d8.x = paVar1[puVar2[2]].x;
      local_1d8.y = paVar1[puVar2[2]].y;
      aVar16 = distance3D((aiVector3D *)local_1a8,local_1c8);
      aVar17 = distance3D(local_1c8,&local_1d8);
      aVar18 = distance3D(&local_1d8,(aiVector3D *)local_1a8);
      fVar20 = (aVar16 + aVar17 + aVar18) * 0.5;
      dVar19 = pow((double)((fVar20 - aVar18) * (fVar20 - aVar17) * (fVar20 - aVar16) * fVar20),0.5)
      ;
    } while ((1e-06 <= (float)dVar19) || (this->mConfigRemoveDegenerates != true));
    rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)&local_200,uVar14);
    *rVar21._M_p = *rVar21._M_p | rVar21._M_mask;
    local_224 = local_224 + 1;
LAB_003b546f:
  }
  if ((this->mConfigRemoveDegenerates == true) && (local_224 != 0)) {
    lVar9 = 0;
    uVar14 = 0;
    for (uVar15 = 0; uVar8 = (uint)uVar14, uVar15 < uVar6; uVar15 = uVar15 + 1) {
      paVar13 = mesh->mFaces;
      rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&local_200,uVar15);
      if ((*rVar21._M_p & rVar21._M_mask) == 0) {
        paVar4 = mesh->mFaces;
        uVar10 = (ulong)(uVar8 + 1);
        paVar4[uVar14].mNumIndices = *(uint *)((long)&paVar13->mNumIndices + lVar9);
        paVar4[uVar14].mIndices = *(uint **)((long)&paVar13->mIndices + lVar9);
        if ((aiFace *)((long)&paVar13->mNumIndices + lVar9) != paVar4 + uVar14) {
          *(undefined4 *)((long)&paVar13->mNumIndices + lVar9) = 0;
          *(undefined8 *)((long)&paVar13->mIndices + lVar9) = 0;
        }
      }
      else {
        pvVar3 = *(void **)((long)&paVar13->mIndices + lVar9);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        *(undefined8 *)((long)&paVar13->mIndices + lVar9) = 0;
        *(undefined4 *)((long)&paVar13->mNumIndices + lVar9) = 0;
        uVar10 = uVar14;
      }
      uVar6 = (ulong)mesh->mNumFaces;
      lVar9 = lVar9 + 0x10;
      uVar14 = uVar10;
    }
    mesh->mNumFaces = uVar8;
    if (uVar8 == 0) {
      pLVar7 = DefaultLogger::get();
      bVar5 = true;
      Logger::debug(pLVar7,"FindDegeneratesProcess removed a mesh full of degenerated primitives");
      goto LAB_003b55fc;
    }
  }
  if ((local_224 != 0) && (bVar5 = DefaultLogger::isNullLogger(), !bVar5)) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[7]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [7])0x5fe1dd);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::operator<<((ostream *)local_1a8," degenerated primitives");
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar7,(char *)local_1c8[0]._0_8_);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  bVar5 = false;
LAB_003b55fc:
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_200);
  return bVar5;
}

Assistant:

bool FindDegeneratesProcess::ExecuteOnMesh( aiMesh* mesh) {
    mesh->mPrimitiveTypes = 0;

    std::vector<bool> remove_me;
    if (mConfigRemoveDegenerates) {
        remove_me.resize( mesh->mNumFaces, false );
    }

    unsigned int deg = 0, limit;
    for ( unsigned int a = 0; a < mesh->mNumFaces; ++a ) {
        aiFace& face = mesh->mFaces[a];
        bool first = true;

        // check whether the face contains degenerated entries
        for (unsigned int i = 0; i < face.mNumIndices; ++i) {
            // Polygons with more than 4 points are allowed to have double points, that is
            // simulating polygons with holes just with concave polygons. However,
            // double points may not come directly after another.
            limit = face.mNumIndices;
            if (face.mNumIndices > 4) {
                limit = std::min( limit, i+2 );
            }

            for (unsigned int t = i+1; t < limit; ++t) {
                if (mesh->mVertices[face.mIndices[ i ] ] == mesh->mVertices[ face.mIndices[ t ] ]) {
                    // we have found a matching vertex position
                    // remove the corresponding index from the array
                    --face.mNumIndices;
                    --limit;
                    for (unsigned int m = t; m < face.mNumIndices; ++m) {
                        face.mIndices[ m ] = face.mIndices[ m+1 ];
                    }
                    --t;

                    // NOTE: we set the removed vertex index to an unique value
                    // to make sure the developer gets notified when his
                    // application attempts to access this data.
                    face.mIndices[ face.mNumIndices ] = 0xdeadbeef;

                    if(first) {
                        ++deg;
                        first = false;
                    }

                    if ( mConfigRemoveDegenerates ) {
                        remove_me[ a ] = true;
                        goto evil_jump_outside; // hrhrhrh ... yeah, this rocks baby!
                    }
                }
            }

            if ( mConfigCheckAreaOfTriangle ) {
                if ( face.mNumIndices == 3 ) {
                    ai_real area = calculateAreaOfTriangle( face, mesh );
                    if ( area < 1e-6 ) {
                        if ( mConfigRemoveDegenerates ) {
                            remove_me[ a ] = true;
                            ++deg;
                            goto evil_jump_outside;
                        }

                        // todo: check for index which is corrupt.
                    }
                }
            }
        }

        // We need to update the primitive flags array of the mesh.
        switch (face.mNumIndices)
        {
        case 1u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
            break;
        case 2u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
            break;
        case 3u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
            break;
        default:
            mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
            break;
        };
evil_jump_outside:
        continue;
    }

    // If AI_CONFIG_PP_FD_REMOVE is true, remove degenerated faces from the import
    if (mConfigRemoveDegenerates && deg) {
        unsigned int n = 0;
        for (unsigned int a = 0; a < mesh->mNumFaces; ++a)
        {
            aiFace& face_src = mesh->mFaces[a];
            if (!remove_me[a]) {
                aiFace& face_dest = mesh->mFaces[n++];

                // Do a manual copy, keep the index array
                face_dest.mNumIndices = face_src.mNumIndices;
                face_dest.mIndices    = face_src.mIndices;

                if (&face_src != &face_dest) {
                    // clear source
                    face_src.mNumIndices = 0;
                    face_src.mIndices = nullptr;
                }
            }
            else {
                // Otherwise delete it if we don't need this face
                delete[] face_src.mIndices;
                face_src.mIndices = nullptr;
                face_src.mNumIndices = 0;
            }
        }
        // Just leave the rest of the array unreferenced, we don't care for now
        mesh->mNumFaces = n;
        if (!mesh->mNumFaces) {
            //The whole mesh consists of degenerated faces
            //signal upward, that this mesh should be deleted.
            ASSIMP_LOG_DEBUG("FindDegeneratesProcess removed a mesh full of degenerated primitives");
            return true;
        }
    }

    if (deg && !DefaultLogger::isNullLogger()) {
        ASSIMP_LOG_WARN_F( "Found ", deg, " degenerated primitives");
    }
    return false;
}